

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string_to_vkformat.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_24c12::StringToVkFormatTest_stringToVkFormat_Test::TestBody
          (StringToVkFormatTest_stringToVkFormat_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffa80;
  VkFormat *in_stack_fffffffffffffa88;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  char *in_stack_fffffffffffffa98;
  int line;
  char *in_stack_fffffffffffffaa0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffaac;
  Type type;
  AssertHelper *in_stack_fffffffffffffab0;
  Message *in_stack_fffffffffffffaf8;
  AssertHelper *in_stack_fffffffffffffb00;
  AssertionResult *this_03;
  AssertionResult local_348 [2];
  undefined4 local_328;
  undefined4 local_324;
  AssertionResult local_320 [2];
  undefined4 local_300;
  undefined4 local_2fc;
  AssertionResult local_2f8 [2];
  undefined4 local_2d8;
  undefined4 local_2d4;
  AssertionResult local_2d0 [2];
  undefined4 local_2b0;
  undefined4 local_2ac;
  AssertionResult local_2a8 [2];
  undefined4 local_288;
  undefined4 local_284;
  AssertionResult local_280 [2];
  undefined4 local_260;
  undefined4 local_25c;
  AssertionResult local_258 [2];
  undefined4 local_238;
  undefined4 local_234;
  AssertionResult local_230 [2];
  undefined4 local_210;
  undefined4 local_20c;
  AssertionResult local_208 [2];
  undefined4 local_1e8;
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1c0;
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  undefined4 local_198;
  undefined4 local_194;
  AssertionResult local_190 [2];
  undefined4 local_170;
  undefined4 local_16c;
  AssertionResult local_168 [2];
  undefined4 local_148;
  undefined4 local_144;
  AssertionResult local_140 [2];
  undefined4 local_120;
  undefined4 local_11c;
  AssertionResult local_118 [2];
  undefined4 local_f8;
  undefined4 local_f4;
  AssertionResult local_f0 [2];
  undefined4 local_d0;
  undefined4 local_cc;
  AssertionResult local_c8 [2];
  undefined4 local_a8;
  undefined4 local_a4;
  AssertionResult local_a0 [2];
  undefined4 local_80;
  undefined4 local_7c;
  AssertionResult local_78 [2];
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = stringToVkFormat("UNDEFINED");
  local_20 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a26d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13a2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a328);
  local_54 = stringToVkFormat();
  local_58 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a3f1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13a454);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a4ac);
  local_7c = stringToVkFormat("Not a format");
  local_80 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a56c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13a5cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a627);
  local_a4 = stringToVkFormat("R4G4_UNORM_PACK8");
  local_a8 = 1;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a6e7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13a74a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a7a2);
  local_cc = stringToVkFormat();
  local_d0 = 1;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a86b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13a8ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a926);
  local_f4 = stringToVkFormat("R8G8B8_UNORM");
  local_f8 = 0x17;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a9e6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13aa49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13aaa1);
  local_11c = stringToVkFormat();
  local_120 = 0x17;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ab6a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13abcd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ac25);
  local_144 = stringToVkFormat("R8G8B8_SNORM");
  local_148 = 0x18;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ace5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13ad48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ada0);
  local_16c = stringToVkFormat();
  local_170 = 0x18;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ae69);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13aecc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13af24);
  local_194 = stringToVkFormat("ASTC_6x6_UNORM_BLOCK");
  local_198 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13afe4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b047);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b09f);
  local_1bc = stringToVkFormat("ASTC_6X6_UNORM_BLOCK");
  local_1c0 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b15f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b1c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b21a);
  local_1e4 = stringToVkFormat("astc_6x6_unorm_block");
  local_1e8 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b2da);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b33d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b395);
  local_20c = stringToVkFormat();
  local_210 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b45e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b4c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b519);
  local_234 = stringToVkFormat("VK_FORMAT_ASTC_6X6_UNORM_BLOCK");
  local_238 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b5d9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b63c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b694);
  local_25c = stringToVkFormat("VK_FORMAT_ASTC_6X6_UNORM_BLOCK");
  local_260 = 0xa5;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b754);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b7b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b80f);
  local_284 = stringToVkFormat("vk_format_astc_6x6_unorm_block");
  local_288 = 0xa5;
  this_03 = local_280;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    in_stack_fffffffffffffaf8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x13b8cf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13b932);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b987);
  local_2ac = stringToVkFormat("VK_FORMAT_ASTC_6x6_UNORM");
  local_2b0 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ba3b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13ba98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13baed);
  local_2d4 = stringToVkFormat("VK_FORMAT_ASTC_6x6_UNORM_BLOC");
  local_2d8 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13bba1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13bbfe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bc53);
  local_2fc = stringToVkFormat("K_FORMAT_ASTC_6x6_UNORM_BLOCK");
  local_300 = 0;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    in_stack_fffffffffffffab0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13bd07);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13bd64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bdb9);
  local_324 = stringToVkFormat("_ASTC_6x6_UNORM_BLOCK");
  local_328 = 0;
  this_02 = local_320;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(VkFormat *)in_stack_fffffffffffffa80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaac);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    in_stack_fffffffffffffa98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13be6d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa80);
    testing::Message::~Message((Message *)0x13beca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bf1f);
  stringToVkFormat("STC_6x6_UNORM_BLOCK");
  this_01 = local_348;
  testing::internal::EqHelper::Compare<VkFormat,_VkFormat,_nullptr>
            (in_stack_fffffffffffffa98,
             (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             (VkFormat *)this_01,(VkFormat *)in_stack_fffffffffffffa80);
  line = (int)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffab0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13bfd3)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffab0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffa90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13c030);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c085);
  return;
}

Assistant:

TEST_F(StringToVkFormatTest, stringToVkFormat) {
    EXPECT_EQ(stringToVkFormat("UNDEFINED"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_UNDEFINED"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("Not a format"), VK_FORMAT_UNDEFINED);

    EXPECT_EQ(stringToVkFormat("R4G4_UNORM_PACK8"), VK_FORMAT_R4G4_UNORM_PACK8);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_R4G4_UNORM_PACK8"), VK_FORMAT_R4G4_UNORM_PACK8);

    EXPECT_EQ(stringToVkFormat("R8G8B8_UNORM"), VK_FORMAT_R8G8B8_UNORM);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_R8G8B8_UNORM"), VK_FORMAT_R8G8B8_UNORM);
    EXPECT_EQ(stringToVkFormat("R8G8B8_SNORM"), VK_FORMAT_R8G8B8_SNORM);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_R8G8B8_SNORM"), VK_FORMAT_R8G8B8_SNORM);

    EXPECT_EQ(stringToVkFormat("ASTC_6x6_UNORM_BLOCK"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("ASTC_6X6_UNORM_BLOCK"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("astc_6x6_unorm_block"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_ASTC_6x6_UNORM_BLOCK"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_ASTC_6X6_UNORM_BLOCK"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_ASTC_6X6_UNORM_BLOCK"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);
    EXPECT_EQ(stringToVkFormat("vk_format_astc_6x6_unorm_block"), VK_FORMAT_ASTC_6x6_UNORM_BLOCK);

    EXPECT_EQ(stringToVkFormat("VK_FORMAT_ASTC_6x6_UNORM"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("VK_FORMAT_ASTC_6x6_UNORM_BLOC"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("K_FORMAT_ASTC_6x6_UNORM_BLOCK"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("_ASTC_6x6_UNORM_BLOCK"), VK_FORMAT_UNDEFINED);
    EXPECT_EQ(stringToVkFormat("STC_6x6_UNORM_BLOCK"), VK_FORMAT_UNDEFINED);
}